

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O1

int __thiscall test_app::upperA::convert(upperA *this,char *begin,char *end,streambuf *out)

{
  char cVar1;
  char cVar2;
  int iVar3;
  
  if (begin != end) {
    do {
      cVar1 = *begin;
      cVar2 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar2 = cVar1;
      }
      if (*(char **)(out + 0x28) < *(char **)(out + 0x30)) {
        **(char **)(out + 0x28) = cVar2;
        *(long *)(out + 0x28) = *(long *)(out + 0x28) + 1;
      }
      else {
        iVar3 = (**(code **)(*(long *)out + 0x68))(out,cVar2);
        if (iVar3 == -1) {
          return -1;
        }
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return 0;
}

Assistant:

int convert(char const *begin,char const *end,std::streambuf *out)
		{
			while(begin!=end) {
				char c=*begin++;
				if('a'<=c && c<='z')
					c = 'A' + (c-'a');
				if(out->sputc(c)==EOF)
					return -1;
			}
			return 0;
		}